

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS ref_clump_short_edges_twod(REF_GRID_conflict ref_grid)

{
  double *pdVar1;
  int iVar2;
  int node1;
  REF_NODE ref_node;
  undefined1 auVar3 [16];
  uint uVar4;
  void *pvVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  char filename [1024];
  REF_EDGE local_450;
  REF_GRID_conflict local_448;
  double local_440;
  char local_438 [1032];
  long lVar14;
  
  ref_node = ref_grid->node;
  uVar4 = ref_edge_create(&local_450,ref_grid);
  if (uVar4 == 0) {
    iVar2 = ref_node->max;
    uVar8 = (ulong)iVar2;
    if ((long)uVar8 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1e7
             ,"ref_clump_short_edges_twod","malloc ratio of REF_DBL negative");
      uVar4 = 1;
    }
    else {
      pvVar5 = malloc(uVar8 * 8);
      auVar3 = _DAT_00213060;
      if (pvVar5 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x1e7,"ref_clump_short_edges_twod","malloc ratio of REF_DBL NULL");
        uVar4 = 2;
      }
      else {
        if (iVar2 != 0) {
          dVar11 = ref_grid->adapt->collapse_ratio;
          dVar11 = dVar11 + dVar11;
          lVar6 = uVar8 - 1;
          auVar12._8_4_ = (int)lVar6;
          auVar12._0_8_ = lVar6;
          auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
          lVar6 = 0;
          auVar12 = auVar12 ^ _DAT_00213060;
          auVar13 = _DAT_00213050;
          do {
            auVar15 = auVar13 ^ auVar3;
            if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                        auVar12._4_4_ < auVar15._4_4_) & 1)) {
              *(double *)((long)pvVar5 + lVar6) = dVar11;
            }
            if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
                auVar15._12_4_ <= auVar12._12_4_) {
              *(double *)((long)pvVar5 + lVar6 + 8) = dVar11;
            }
            lVar14 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 2;
            auVar13._8_8_ = lVar14 + 2;
            lVar6 = lVar6 + 0x10;
          } while ((ulong)(iVar2 + 1U >> 1) << 4 != lVar6);
        }
        if (0 < local_450->n) {
          lVar6 = 0;
          local_448 = ref_grid;
          do {
            iVar2 = local_450->e2n[lVar6 * 2];
            node1 = local_450->e2n[lVar6 * 2 + 1];
            uVar4 = ref_node_ratio(ref_node,iVar2,node1,&local_440);
            if (uVar4 != 0) {
              pcVar9 = "ratio";
              uVar7 = 0x1ed;
              goto LAB_00203539;
            }
            dVar11 = *(double *)((long)pvVar5 + (long)iVar2 * 8);
            if (local_440 <= dVar11) {
              dVar11 = local_440;
            }
            *(double *)((long)pvVar5 + (long)iVar2 * 8) = dVar11;
            dVar11 = *(double *)((long)pvVar5 + (long)node1 * 8);
            if (local_440 <= dVar11) {
              dVar11 = local_440;
            }
            *(double *)((long)pvVar5 + (long)node1 * 8) = dVar11;
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_450->n);
          uVar8 = (ulong)(uint)ref_node->max;
          ref_grid = local_448;
        }
        if (0 < (int)uVar8) {
          lVar6 = 0;
          uVar10 = 0;
          do {
            dVar11 = ref_grid->adapt->collapse_ratio;
            pdVar1 = (double *)((long)pvVar5 + lVar6 * 8);
            if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
              snprintf(local_438,0x400,"clump%d.t",uVar10);
              uVar4 = ref_clump_tri_around(ref_grid,(REF_INT)lVar6,local_438);
              if (uVar4 != 0) {
                pcVar9 = "dump";
                uVar7 = 0x1f6;
                goto LAB_00203539;
              }
              uVar10 = (ulong)((int)uVar10 + 1);
              uVar8 = (ulong)(uint)ref_node->max;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < (int)uVar8);
        }
        uVar4 = 0;
      }
    }
  }
  else {
    pcVar9 = "orig edges";
    uVar7 = 0x1e4;
LAB_00203539:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar7,
           "ref_clump_short_edges_twod",(ulong)uVar4,pcVar9);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_clump_short_edges_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT ntarget;
  REF_INT node, node0, node1;
  REF_INT edge;
  REF_DBL edge_ratio;

  char filename[1024];

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      snprintf(filename, 1024, "clump%d.t", ntarget);
      RSS(ref_clump_tri_around(ref_grid, node, filename), "dump");
      ntarget++;
    }

  return REF_SUCCESS;
}